

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O2

void __thiscall
fizplex::BaseTestRegularWithReordering_ForwardTransformSVector_Test::
BaseTestRegularWithReordering_ForwardTransformSVector_Test
          (BaseTestRegularWithReordering_ForwardTransformSVector_Test *this)

{
  BaseTestRegularWithReordering::BaseTestRegularWithReordering
            (&this->super_BaseTestRegularWithReordering);
  (this->super_BaseTestRegularWithReordering).super_Test._vptr_Test =
       (_func_int **)&PTR__BaseTestRegularWithReordering_001bf7b0;
  return;
}

Assistant:

TEST_F(BaseTestRegularWithReordering, ForwardTransformSVector) {
  b.ftran(sv0);
  b.ftran(sv1);
  b.ftran(sv2);
  EXPECT_EQ(SVector({{0, -2.0 / 71}, {1, 17.0 / 71}, {2, 37.0 / 71}}), sv0);
  EXPECT_EQ(SVector({{0, 8.0 / 71}, {1, 3.0 / 71}, {2, -6.0 / 71}}), sv1);
  EXPECT_EQ(SVector({{0, -5.0 / 71}, {1, 7.0 / 71}, {2, -14.0 / 71}}), sv2);
}